

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSatG.c
# Opt level: O1

Abc_Cex_t * Cec3_ManDeriveCex(Gia_Man_t *p,int iOut,int iPat)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  Abc_Cex_t *pAVar4;
  ulong uVar5;
  uint uVar6;
  
  pAVar4 = Abc_CexAlloc(0,p->vCis->nSize,1);
  pAVar4->iPo = iOut;
  if ((iPat != -1) && (pVVar2 = p->vCis, 0 < pVVar2->nSize)) {
    piVar3 = pVVar2->pArray;
    uVar5 = 0;
    do {
      iVar1 = piVar3[uVar5];
      if ((iVar1 < 0) || (p->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (iVar1 == 0) {
        return pAVar4;
      }
      uVar6 = iVar1 * p->nSimWords;
      if (((int)uVar6 < 0) || (p->vSims->nSize <= (int)uVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      if ((*(uint *)((long)p->vSims->pArray + (long)(iPat >> 5) * 4 + (ulong)uVar6 * 8) &
          1 << ((byte)iPat & 0x1f)) != 0) {
        (&pAVar4[1].iPo)[uVar5 >> 5 & 0x7ffffff] =
             (&pAVar4[1].iPo)[uVar5 >> 5 & 0x7ffffff] | 1 << ((byte)uVar5 & 0x1f);
      }
      uVar5 = uVar5 + 1;
    } while ((long)uVar5 < (long)pVVar2->nSize);
  }
  return pAVar4;
}

Assistant:

Abc_Cex_t * Cec3_ManDeriveCex( Gia_Man_t * p, int iOut, int iPat )
{
    Abc_Cex_t * pCex;
    int i, Id;
    pCex = Abc_CexAlloc( 0, Gia_ManCiNum(p), 1 );
    pCex->iPo = iOut;
    if ( iPat == -1 )
        return pCex;
    Gia_ManForEachCiId( p, Id, i )
        if ( Abc_InfoHasBit((unsigned *)Cec3_ObjSim(p, Id), iPat) )
            Abc_InfoSetBit( pCex->pData, i );
    return pCex;
}